

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadgamma.hpp
# Opt level: O2

int upload_gamma(int n)

{
  float *data;
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  vector<TensorEntry,_std::allocator<TensorEntry>_> v;
  
  readGamma(&v,n);
  data = (float *)operator_new__(0x1000000);
  lVar1 = ((long)v.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)v.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
                super__Vector_impl_data._M_start) / 0xc;
  pfVar3 = data + 3;
  pfVar2 = &(v.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
             super__Vector_impl_data._M_start)->val;
  while (bVar4 = lVar1 != 0, lVar1 = lVar1 + -1, bVar4) {
    auVar5 = pshuflw(ZEXT416((uint)*(float *)(pfVar2 + -2)),ZEXT416((uint)*(float *)(pfVar2 + -2)),
                     0x60);
    *(ulong *)(pfVar3 + -3) = CONCAT44((float)(auVar5._4_4_ >> 0x10),(float)(auVar5._0_4_ >> 0x10));
    pfVar3[-1] = (float)(int)*(short *)(pfVar2 + -1);
    *pfVar3 = *pfVar2;
    pfVar3 = pfVar3 + 4;
    pfVar2 = pfVar2 + 3;
  }
  (*glad_glActiveTexture)(33999);
  create_2D_float_texture(0x400,0x400,4,data,0x2600,false);
  operator_delete__(data);
  std::_Vector_base<TensorEntry,_std::allocator<TensorEntry>_>::~_Vector_base
            (&v.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>);
  return (int)(((long)v.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)v.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0xc);
}

Assistant:

int upload_gamma(int n)
{
	auto v = readGamma(n);
	const int width = 1024;
	const int height = 1024;
	float* data = new float[width * height * 4];
	for (int i=0; i<v.size(); ++i)
	{
		data[i*4+0] = float(v[i].a);
		data[i*4+1] = float(v[i].b);
		data[i*4+2] = float(v[i].c);
		data[i*4+3] = v[i].val;
	}
	glActiveTexture(GL_TEXTURE15);
	create_2D_float_texture(1024, 1024, 4, data, GL_NEAREST);
	delete[] data;
	return v.size();
}